

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

int Abc_NtkMinimumBase2(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  Abc_Obj_t *pNode;
  long *plVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                  ,0x5f,"int Abc_NtkMinimumBase2(Abc_Ntk_t *)");
  }
  pVVar4 = pNtk->vObjs;
  iVar5 = pVVar4->nSize;
  if (0 < (long)iVar5) {
    ppvVar1 = pVVar4->pArray;
    lVar6 = 0;
    do {
      if (ppvVar1[lVar6] != (void *)0x0) {
        *(undefined4 *)((long)ppvVar1[lVar6] + 0x2c) = 0;
      }
      lVar6 = lVar6 + 1;
    } while (iVar5 != lVar6);
    if (0 < iVar5) {
      lVar6 = 0;
      iVar5 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar4->pArray[lVar6];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          iVar3 = Abc_NodeMinimumBase2(pNode);
          iVar5 = iVar5 + iVar3;
          pVVar4 = pNtk->vObjs;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
      if (pVVar4->nSize < 1) {
        return iVar5;
      }
      lVar6 = 0;
      do {
        plVar2 = (long *)pVVar4->pArray[lVar6];
        if ((plVar2 != (long *)0x0) && (0 < *(int *)((long)plVar2 + 0x1c))) {
          lVar7 = 0;
          do {
            Vec_IntPush((Vec_Int_t *)
                        (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)(plVar2[4] + lVar7 * 4) * 8) + 0x28),(int)plVar2[2])
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar2 + 0x1c));
          pVVar4 = pNtk->vObjs;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

int Abc_NtkMinimumBase2( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k, Counter;
    assert( Abc_NtkIsBddLogic(pNtk) );
    // remove all fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_IntClear( &pNode->vFanouts );
    // add useful fanins
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeMinimumBase2( pNode );
    // add fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Abc_ObjForEachFanin( pNode, pFanin, k )
            Vec_IntPush( &pFanin->vFanouts, Abc_ObjId(pNode) );
    return Counter;
}